

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

LValue * __thiscall
slang::ast::ElementSelectExpression::evalLValueImpl
          (ElementSelectExpression *this,EvalContext *context)

{
  ConstantRange range_00;
  bool bVar1;
  undefined1 uVar2;
  Expression *defaultValue;
  ConstantRange *pCVar3;
  Type *pTVar4;
  undefined1 uVar5;
  ElementSelectExpression *in_RSI;
  LValue *in_RDI;
  optional<slang::ConstantRange> oVar6;
  Type *valType;
  optional<slang::ConstantRange> range;
  ConstantValue associativeIndex;
  bool softFail;
  ConstantValue loadedVal;
  LValue lval;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  int32_t iVar7;
  EvalContext *in_stack_fffffffffffffc60;
  Type *in_stack_fffffffffffffc68;
  int32_t in_stack_fffffffffffffc70;
  int32_t in_stack_fffffffffffffc74;
  undefined7 in_stack_fffffffffffffcb0;
  int32_t index;
  undefined7 in_stack_fffffffffffffcc0;
  LValue *this_00;
  LValue *in_stack_fffffffffffffe08;
  bool *in_stack_fffffffffffffea0;
  ConstantValue *in_stack_fffffffffffffea8;
  ConstantValue *in_stack_fffffffffffffeb0;
  EvalContext *in_stack_fffffffffffffeb8;
  ElementSelectExpression *in_stack_fffffffffffffec0;
  
  this_00 = in_RDI;
  value(in_RSI);
  Expression::evalLValue((Expression *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  bVar1 = LValue::operator_cast_to_bool((LValue *)0xbc4cb4);
  if (bVar1) {
    slang::ConstantValue::ConstantValue((ConstantValue *)0xbc4d13);
    defaultValue = value(in_RSI);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbc4d35);
    uVar2 = Type::hasFixedRange((Type *)in_stack_fffffffffffffc60);
    if (!(bool)uVar2) {
      LValue::load(in_stack_fffffffffffffe08);
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffc60,
                 (ConstantValue *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xbc4d8f);
    }
    slang::ConstantValue::ConstantValue((ConstantValue *)0xbc4dc4);
    oVar6 = evalIndex(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                      in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    index = oVar6.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_payload._4_4_;
    uVar5 = oVar6.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::ConstantRange> *)0xbc4e3c);
    if ((bVar1) || (bVar1 = slang::ConstantValue::bad((ConstantValue *)0xbc4e51), !bVar1)) {
      value(in_RSI);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xbc4f67);
      bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffffc60);
      if (bVar1) {
        bVar1 = Type::isUnpackedArray
                          ((Type *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        if (bVar1) {
          std::optional<slang::ConstantRange>::operator->
                    ((optional<slang::ConstantRange> *)0xbc4fc8);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xbc4fdf);
          Type::getDefaultValue(in_stack_fffffffffffffc68);
          LValue::addIndex((LValue *)CONCAT17(uVar2,in_stack_fffffffffffffcc0),index,
                           (ConstantValue *)CONCAT17(uVar5,in_stack_fffffffffffffcb0));
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xbc5022);
        }
        else {
          std::optional<slang::ConstantRange>::operator*((optional<slang::ConstantRange> *)0xbc5057)
          ;
          range_00.right = in_stack_fffffffffffffc74;
          range_00.left = in_stack_fffffffffffffc70;
          LValue::addBitSlice((LValue *)in_stack_fffffffffffffc68,range_00);
        }
        LValue::LValue((LValue *)in_stack_fffffffffffffc60,
                       (LValue *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      }
      else {
        bVar1 = Type::isAssociativeArray((Type *)0xbc50ad);
        if (bVar1) {
          pTVar4 = not_null<const_slang::ast::Type_*>::operator->
                             ((not_null<const_slang::ast::Type_*> *)0xbc50d1);
          Type::getDefaultValue(pTVar4);
          LValue::addArrayLookup(this_00,(ConstantValue *)in_RDI,(ConstantValue *)defaultValue);
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xbc5118);
          LValue::LValue((LValue *)in_stack_fffffffffffffc60,
                         (LValue *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        }
        else {
          pCVar3 = std::optional<slang::ConstantRange>::operator->
                             ((optional<slang::ConstantRange> *)0xbc5176);
          iVar7 = pCVar3->left;
          pTVar4 = not_null<const_slang::ast::Type_*>::operator->
                             ((not_null<const_slang::ast::Type_*> *)0xbc518d);
          Type::getDefaultValue(in_stack_fffffffffffffc68);
          LValue::addIndex((LValue *)CONCAT17(uVar2,in_stack_fffffffffffffcc0),index,
                           (ConstantValue *)CONCAT17(uVar5,in_stack_fffffffffffffcb0));
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xbc51d0);
          LValue::LValue((LValue *)pTVar4,(LValue *)CONCAT44(iVar7,in_stack_fffffffffffffc58));
        }
      }
    }
    else {
      LValue::LValue((LValue *)in_stack_fffffffffffffc60,
                     (nullptr_t)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xbc5222);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xbc522f);
  }
  else {
    LValue::LValue((LValue *)in_stack_fffffffffffffc60,
                   (nullptr_t)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  }
  LValue::~LValue((LValue *)0xbc525a);
  return this_00;
}

Assistant:

LValue ElementSelectExpression::evalLValueImpl(EvalContext& context) const {
    LValue lval = value().evalLValue(context);
    if (!lval)
        return nullptr;

    ConstantValue loadedVal;
    if (!value().type->hasFixedRange())
        loadedVal = lval.load();

    bool softFail = false;
    ConstantValue associativeIndex;
    auto range = evalIndex(context, loadedVal, associativeIndex, softFail);
    if (!range && associativeIndex.bad()) {
        if (!softFail)
            return nullptr;

        // Add an out of bounds entry so that reads will return the default
        // and writes will be ignored.
        lval.addIndexOutOfBounds(type->getDefaultValue());
        return lval;
    }

    // Handling for packed and unpacked arrays, all integer types.
    const Type& valType = *value().type;
    if (valType.hasFixedRange()) {
        // For fixed types, we know we will always be in range, so just do the selection.
        if (valType.isUnpackedArray())
            lval.addIndex(range->left, type->getDefaultValue());
        else
            lval.addBitSlice(*range);
        return lval;
    }

    // Handling for associative arrays.
    if (valType.isAssociativeArray()) {
        lval.addArrayLookup(std::move(associativeIndex), type->getDefaultValue());
        return lval;
    }

    // Handling for strings, dynamic arrays, and queues.
    SLANG_ASSERT(range->left == range->right);
    lval.addIndex(range->left, type->getDefaultValue());

    return lval;
}